

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

bool Ptex::v2_2::PtexUtils::isConstant(void *data,int stride,int ures,int vres,int pixelSize)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  size_t __n;
  bool bVar4;
  bool bVar5;
  
  if (1 < vres) {
    pvVar2 = (void *)((long)data + (long)stride);
    iVar3 = vres + -1;
    do {
      iVar1 = bcmp(data,pvVar2,(long)(pixelSize * ures));
      if (iVar1 != 0) {
        return false;
      }
      pvVar2 = (void *)((long)pvVar2 + (long)stride);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  bVar5 = true;
  if (1 < ures) {
    __n = (size_t)pixelSize;
    pvVar2 = (void *)((long)data + __n);
    iVar3 = ures + -2;
    do {
      iVar1 = bcmp(data,pvVar2,__n);
      bVar4 = iVar3 != 0;
      iVar3 = iVar3 + -1;
      bVar5 = iVar1 == 0;
      if (!bVar5) {
        return bVar5;
      }
      pvVar2 = (void *)((long)pvVar2 + __n);
    } while (bVar4);
  }
  return bVar5;
}

Assistant:

bool isConstant(const void* data, int stride, int ures, int vres,
                int pixelSize)
{
    int rowlen = pixelSize * ures;
    const char* p = (const char*) data + stride;

    // compare each row with the first
    for (int i = 1; i < vres; i++, p += stride)
        if (0 != memcmp(data, p, rowlen)) return 0;

    // make sure first row is constant
    p = (const char*) data + pixelSize;
    for (int i = 1; i < ures; i++, p += pixelSize)
        if (0 != memcmp(data, p, pixelSize)) return 0;

    return 1;
}